

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O0

void __thiscall FileWriter::~FileWriter(FileWriter *this)

{
  FileWriter *in_RDI;
  
  ~FileWriter(in_RDI);
  operator_delete(in_RDI,0x248);
  return;
}

Assistant:

FileWriter::~FileWriter() {
}